

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

string * __thiscall pbrt::FresnelDielectric::ToString_abi_cxx11_(FresnelDielectric *this)

{
  string *in_RDI;
  float *unaff_retaddr;
  char *in_stack_00000008;
  
  StringPrintf<float_const&,char_const*>(in_stack_00000008,unaff_retaddr,(char **)in_RDI);
  return in_RDI;
}

Assistant:

std::string FresnelDielectric::ToString() const {
    return StringPrintf("[ FrenselDielectric eta: %f opaque: %s ]", eta,
                        opaque ? "true" : "false");
}